

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  appender *paVar5;
  appender it;
  bool local_269;
  int local_250;
  int local_24c;
  undefined1 local_231;
  int local_230;
  char local_229;
  anon_class_56_7_162c6e41 local_228;
  float_specs local_1f0;
  bool local_1e5;
  int local_1e4;
  undefined1 auStack_1e0 [3];
  bool pointy;
  int num_zeros;
  char **local_1d8;
  int *local_1d0;
  int *local_1c8;
  char *local_1c0;
  digit_grouping<char> *local_1b8;
  int *local_1b0;
  char *local_1a8;
  float_specs local_1a0;
  big_decimal_fp *local_198;
  undefined1 local_190 [8];
  digit_grouping<char> grouping_1;
  undefined1 auStack_160 [4];
  int num_zeros_3;
  char **local_158;
  int *local_150;
  basic_format_specs<char> *local_148;
  digit_grouping<char> *local_140;
  locale_ref *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  float_specs local_118;
  big_decimal_fp *local_100;
  undefined1 local_f8 [8];
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  undefined1 local_a8 [8];
  anon_class_40_8_dbbf3351 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char local_51;
  size_t sStack_50;
  char decimal_point;
  size_t size;
  sign_t sign;
  char zero;
  char *pcStack_40;
  int significand_size;
  char *significand;
  basic_format_specs<char> *specs_local;
  big_decimal_fp *f_local;
  locale_ref loc_local;
  float_specs fspecs_local;
  appender out_local;
  
  pcStack_40 = f->significand;
  significand = (char *)specs;
  specs_local = (basic_format_specs<char> *)f;
  f_local = (big_decimal_fp *)loc.locale_;
  loc_local.locale_ = (void *)fspecs;
  fspecs_local = (float_specs)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  size._4_4_ = get_significand_size(f);
  size._3_1_ = 0x30;
  size._2_1_ = (sign_t)((ulong)loc_local.locale_ >> 0x28);
  tVar3 = to_unsigned<int>(size._4_4_);
  sStack_50 = (size_t)(tVar3 + (size._2_1_ != none));
  if ((loc_local.locale_._4_4_ >> 0x11 & 1) == 0) {
    local_229 = '.';
  }
  else {
    stack0xffffffffffffffa0 = f_local;
    local_229 = decimal_point<char>((locale_ref)f_local);
  }
  local_51 = local_229;
  use_exp_format.fspecs.precision = *(int *)((specs_local->fill).data_ + 1) + size._4_4_ + -1;
  _abs_output_exp = (float_specs)loc_local.locale_;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar2 = do_write_float<fmt::v9::appender,_fmt::v9::detail::big_decimal_fp,_char,_fmt::v9::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)&abs_output_exp);
  if (bVar2) {
    exp_digits = 0;
    if ((loc_local.locale_._4_4_ >> 0x13 & 1) == 0) {
      if (size._4_4_ == 1) {
        local_51 = '\0';
      }
    }
    else {
      exp_digits = (int)loc_local.locale_ - size._4_4_;
      if (exp_digits < 0) {
        exp_digits = 0;
      }
      tVar3 = to_unsigned<int>(exp_digits);
      sStack_50 = tVar3 + sStack_50;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_230 = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_230 = use_exp_format.fspecs._4_4_;
    }
    write._36_4_ = 2;
    if ((99 < local_230) && (write._36_4_ = 3, 999 < local_230)) {
      write._36_4_ = 4;
    }
    tVar3 = to_unsigned<int>((local_51 != '\0') + 2 + write._36_4_);
    fVar1 = fspecs_local;
    sStack_50 = tVar3 + sStack_50;
    local_231 = 0x45;
    if (((ulong)loc_local.locale_ & 0x1000000000000) == 0) {
      local_231 = 0x65;
    }
    write.output_exp._3_1_ = local_231;
    local_a8[0] = size._2_1_;
    write._0_8_ = pcStack_40;
    write.significand._0_4_ = size._4_4_;
    write.significand._4_1_ = local_51;
    write.significand_size = exp_digits;
    write.decimal_point = '0';
    write._21_1_ = local_231;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (*(int *)significand < 1) {
      paVar5 = reserve<fmt::v9::appender>((appender *)&fspecs_local,sStack_50);
      it = do_write_float<fmt::v9::appender,_fmt::v9::detail::big_decimal_fp,_char,_fmt::v9::detail::digit_grouping<char>_>
           ::anon_class_40_8_dbbf3351::operator()
                     ((anon_class_40_8_dbbf3351 *)local_a8,
                      (iterator)
                      (paVar5->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container
                     );
      out_local = base_iterator<fmt::v9::appender>((appender)fVar1,it);
    }
    else {
      out_local = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                            ((appender)fspecs_local,(basic_format_specs<char> *)significand,
                             sStack_50,(anon_class_40_8_dbbf3351 *)local_a8);
    }
  }
  else {
    grouping.sep_._36_4_ = *(int *)((specs_local->fill).data_ + 1) + size._4_4_;
    if (*(int *)((specs_local->fill).data_ + 1) < 0) {
      if ((int)grouping.sep_._36_4_ < 1) {
        local_1e4 = -grouping.sep_._36_4_;
        if (((size._4_4_ == 0) && (-1 < (int)loc_local.locale_)) &&
           ((int)loc_local.locale_ < local_1e4)) {
          local_1e4 = (int)loc_local.locale_;
        }
        local_269 = true;
        if ((local_1e4 == 0) && (local_269 = true, size._4_4_ == 0)) {
          local_269 = (bool)((byte)(loc_local.locale_._4_4_ >> 0x13) & 1);
        }
        local_1e5 = local_269;
        tVar3 = to_unsigned<int>(local_1e4);
        sStack_50 = ((local_269 != false) + 1 + tVar3) + sStack_50;
        local_1f0 = fspecs_local;
        local_228.sign = (sign_t *)((long)&size + 2);
        local_228.zero = (char *)((long)&size + 3);
        local_228.pointy = &local_1e5;
        local_228.decimal_point = &local_51;
        local_228.num_zeros = &local_1e4;
        local_228.significand = &stack0xffffffffffffffc0;
        local_228.significand_size = (int *)((long)&size + 4);
        out_local = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>
                              ((appender)fspecs_local,(basic_format_specs<char> *)significand,
                               sStack_50,&local_228);
      }
      else {
        if ((loc_local.locale_._4_4_ >> 0x13 & 1) == 0) {
          local_24c = 0;
        }
        else {
          local_24c = (int)loc_local.locale_ - size._4_4_;
        }
        grouping_1.sep_._36_4_ = local_24c;
        if (local_24c < 1) {
          local_250 = 0;
        }
        else {
          local_250 = local_24c;
        }
        tVar3 = to_unsigned<int>(local_250);
        sStack_50 = sStack_50 + (tVar3 + 1);
        local_198 = f_local;
        digit_grouping<char>::digit_grouping
                  ((digit_grouping<char> *)local_190,(locale_ref)f_local,
                   (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
        iVar4 = digit_grouping<char>::count_separators((digit_grouping<char> *)local_190,size._4_4_)
        ;
        tVar3 = to_unsigned<int>(iVar4);
        sStack_50 = sStack_50 + tVar3;
        local_1a0 = fspecs_local;
        _auStack_1e0 = (sign_t *)((long)&size + 2);
        local_1d8 = &stack0xffffffffffffffc0;
        local_1d0 = (int *)((long)&size + 4);
        local_1c8 = (int *)&grouping.sep_.field_0x24;
        local_1c0 = &local_51;
        local_1b8 = (digit_grouping<char> *)local_190;
        local_1b0 = (int *)&grouping_1.sep_.field_0x24;
        local_1a8 = (char *)((long)&size + 3);
        out_local = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>
                              ((appender)fspecs_local,(basic_format_specs<char> *)significand,
                               sStack_50,(anon_class_64_8_e6ffa566 *)auStack_1e0);
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_190);
      }
    }
    else {
      tVar3 = to_unsigned<int>(*(int *)((specs_local->fill).data_ + 1));
      sStack_50 = tVar3 + sStack_50;
      grouping.sep_._32_4_ = (int)loc_local.locale_ - grouping.sep_._36_4_;
      abort_fuzzing_if(5000 < (int)grouping.sep_._32_4_);
      if ((loc_local.locale_._4_4_ >> 0x13 & 1) != 0) {
        sStack_50 = sStack_50 + 1;
        if (((int)grouping.sep_._32_4_ < 1) && ((char)((ulong)loc_local.locale_ >> 0x20) != '\x02'))
        {
          grouping.sep_.thousands_sep = '\x01';
          grouping.sep_._33_3_ = 0;
        }
        if (0 < (int)grouping.sep_._32_4_) {
          tVar3 = to_unsigned<int>(grouping.sep_._32_4_);
          sStack_50 = tVar3 + sStack_50;
        }
      }
      local_100 = f_local;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_f8,(locale_ref)f_local,
                 (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
      iVar4 = digit_grouping<char>::count_separators
                        ((digit_grouping<char> *)local_f8,grouping.sep_._36_4_);
      tVar3 = to_unsigned<int>(iVar4);
      sStack_50 = sStack_50 + tVar3;
      local_118 = fspecs_local;
      _auStack_160 = (sign_t *)((long)&size + 2);
      local_158 = &stack0xffffffffffffffc0;
      local_150 = (int *)((long)&size + 4);
      local_148 = specs_local;
      local_140 = (digit_grouping<char> *)local_f8;
      local_138 = &loc_local;
      local_130 = &local_51;
      local_128 = &grouping.sep_.thousands_sep;
      local_120 = (char *)((long)&size + 3);
      out_local = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>
                            ((appender)fspecs_local,(basic_format_specs<char> *)significand,
                             sStack_50,(anon_class_72_9_0c6a3a8a *)auStack_160);
      digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_f8);
    }
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}